

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O2

long __thiscall Vector::extractMin(Vector *this,VectorDouble *values)

{
  long lVar1;
  double dVar2;
  char *pcVar3;
  char *__filename;
  unsigned_long i;
  char *pcVar4;
  double dVar5;
  
  __filename = (char *)0xffffffffffffffff;
  dVar5 = 1.79769313486232e+308;
  for (pcVar4 = (char *)0x0; (char *)this->vLength != pcVar4; pcVar4 = pcVar4 + 1) {
    dVar2 = values->vData[this->vData[(long)pcVar4]];
    pcVar3 = pcVar4;
    if (dVar5 <= values->vData[this->vData[(long)pcVar4]]) {
      dVar2 = dVar5;
      pcVar3 = __filename;
    }
    __filename = pcVar3;
    dVar5 = dVar2;
  }
  if (-1 < (long)__filename) {
    lVar1 = this->vData[(long)__filename];
    remove(this,__filename);
    __filename = (char *)(long)(double)lVar1;
  }
  return (long)__filename;
}

Assistant:

long Vector::extractMin(VectorDouble &values) {
  double current_min = DBL_MAX;
  long best_index = -1;

  for (unsigned long i = 0; i < vLength; i++) {
    double try_value = values.value(vData[i]);
    if (try_value < current_min) {
      best_index = i;
      current_min = try_value;
    }
  }

  if (best_index >= 0) {
    current_min = vData[best_index];
    remove(best_index);
    return current_min;
  }

  return best_index;
}